

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O1

string * translateOperatorNames(string *__return_storage_ptr__,string *s,int characteristic)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  bool bVar4;
  runtime_error *this;
  ulong uVar5;
  _AutomatonPtr *p_Var6;
  _AutomatonPtr *p_Var7;
  long lVar8;
  initializer_list<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_> __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
  ereps;
  vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
  mreps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  estrs;
  regex e1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mstrs;
  regex e6;
  regex e5;
  regex e4;
  regex e3;
  regex e2;
  regex m12;
  regex m11;
  regex m10;
  regex m9;
  regex m8;
  regex m7;
  regex m6;
  regex m5;
  regex m4;
  regex m3;
  regex m2;
  regex m1;
  allocator_type local_465;
  int local_464;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_460;
  vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
  local_458;
  vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
  local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  undefined1 *local_408 [2];
  undefined1 local_3f8 [16];
  undefined1 *local_3e8 [2];
  undefined1 local_3d8 [16];
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_3c8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_3a8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_388;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_368;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_348;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_328;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_308;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_2e8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_2c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_288;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_250;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_230;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_210;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_1f0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_1d0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_1b0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_190;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_170;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_150;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_130;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_110;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_f0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_d0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_b0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_90;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_70;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_50,"(\\bMAX )",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_70,"(\\bmax )",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_90,"(\\bMAX\\()",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_b0,"(\\bmax\\()",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_d0,"(\\bMIN )",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_f0,"(\\bmin )",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_110,"(\\bMIN\\()",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_130,"(\\bmin\\()",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_150,"(\\bNOT )",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_170,"(\\bnot )",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_190,"(\\bNOT\\()",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_1b0,"(\\bnot\\()",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_428,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_50);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_408,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_70);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_3e8,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_90);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_3c8,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_b0);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_3a8,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_d0);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_388,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_f0);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_368,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_110);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_348,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_130);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_328,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_150);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_308,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_170);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_2e8,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_190);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_2c8,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_1b0);
  __l._M_len = 0xc;
  __l._M_array = (iterator)&local_428;
  std::
  vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
  ::vector(&local_440,__l,(allocator_type *)&local_288);
  lVar8 = 0x160;
  local_464 = characteristic;
  do {
    Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               ((long)&local_428._M_dataplus._M_p + lVar8));
    lVar8 = lVar8 + -0x20;
  } while (lVar8 != -0x20);
  paVar1 = &local_428.field_2;
  local_428._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,">","");
  local_408[0] = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,">","");
  local_3e8[0] = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,">(","");
  local_3c8._0_8_ = (long)&local_3c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,">(","");
  local_3a8._0_8_ = (long)&local_3a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"<","");
  p_Var6 = &local_388._M_automaton;
  local_388._0_8_ = p_Var6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"<","");
  local_368._0_8_ = (long)&local_368 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"<(","");
  local_348._0_8_ = (long)&local_348 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"<(","");
  local_328._0_8_ = (long)&local_328 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"~","");
  local_308._0_8_ = (long)&local_308 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"~","");
  local_2e8._0_8_ = (long)&local_2e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"~(","");
  p_Var7 = &local_2c8._M_automaton;
  local_2c8._0_8_ = p_Var7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"~(","");
  __l_00._M_len = 0xc;
  __l_00._M_array = &local_428;
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_268,__l_00,(allocator_type *)&local_288);
  lVar8 = -0x180;
  do {
    if (p_Var7 != (_AutomatonPtr *)*(undefined1 **)(p_Var7 + -1)) {
      operator_delete(*(undefined1 **)(p_Var7 + -1),
                      (ulong)((long)&(((p_Var7->
                                       super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr)->super__NFA_base)._M_paren_stack.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl + 1));
    }
    p_Var7 = p_Var7 + -2;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  local_460 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_460;
  pcVar2 = (s->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + s->_M_string_length);
  if (local_440.
      super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_440.
      super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar8 = 0;
    uVar5 = 0;
    do {
      local_428._M_string_length = 0;
      local_428.field_2._M_allocated_capacity =
           local_428.field_2._M_allocated_capacity & 0xffffffffffffff00;
      _Var3._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
      local_428._M_dataplus._M_p = (pointer)paVar1;
      std::
      __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_428,
                 _Var3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(_Var3._M_current + __return_storage_ptr__->_M_string_length),
                 (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                 ((long)&(local_440.
                          super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_flags + lVar8),
                 *(char **)((long)&((local_268.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           lVar8),
                 *(size_t *)
                  ((long)&(local_268.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length + lVar8),0);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_428);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != paVar1) {
        operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
      }
      uVar5 = uVar5 + 1;
      lVar8 = lVar8 + 0x20;
    } while (uVar5 < (ulong)((long)local_440.
                                   super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_440.
                                   super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_288,"(\\bAND) +",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_1d0,"(\\band) +",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_1f0,"(\\bOR +)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_210,"(\\bor +)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_230,"(\\bXOR +)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_250,"(\\bxor +)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_428,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_288);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_408,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_1d0);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_3e8,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_1f0);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_3c8,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_210);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_3a8,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_230);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_388,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_250);
  __l_01._M_len = 6;
  __l_01._M_array = (iterator)&local_428;
  std::
  vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
  ::vector(&local_458,__l_01,(allocator_type *)&local_2a0);
  lVar8 = 0xa0;
  do {
    Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               ((long)&local_428._M_dataplus._M_p + lVar8));
    lVar8 = lVar8 + -0x20;
  } while (lVar8 != -0x20);
  local_428._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"*","");
  local_408[0] = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"*","");
  local_3e8[0] = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"|","");
  local_3c8._0_8_ = (long)&local_3c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"|","");
  local_3a8._0_8_ = (long)&local_3a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"+","");
  local_388._0_8_ = p_Var6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"+","");
  __l_02._M_len = 6;
  __l_02._M_array = &local_428;
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2a0,__l_02,&local_465);
  lVar8 = -0xc0;
  do {
    if (p_Var6 != (_AutomatonPtr *)*(undefined1 **)(p_Var6 + -1)) {
      operator_delete(*(undefined1 **)(p_Var6 + -1),
                      (ulong)((long)&(((p_Var6->
                                       super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr)->super__NFA_base)._M_paren_stack.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl + 1));
    }
    p_Var6 = p_Var6 + -2;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  if (local_464 == 2) {
    if (local_458.
        super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_458.
        super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar8 = 0;
      uVar5 = 0;
      do {
        local_428._M_string_length = 0;
        local_428.field_2._M_allocated_capacity =
             local_428.field_2._M_allocated_capacity & 0xffffffffffffff00;
        _Var3._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
        local_428._M_dataplus._M_p = (pointer)paVar1;
        std::
        __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_428,
                   _Var3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(_Var3._M_current + __return_storage_ptr__->_M_string_length),
                   (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                   ((long)&(local_458.
                            super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_flags + lVar8),
                   *(char **)((long)&((local_2a0.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar8),
                   *(size_t *)
                    ((long)&(local_2a0.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length + lVar8),0
                  );
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_428);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_dataplus._M_p != paVar1) {
          operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
        }
        uVar5 = uVar5 + 1;
        lVar8 = lVar8 + 0x20;
      } while (uVar5 < (ulong)((long)local_458.
                                     super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_458.
                                     super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
  }
  else if (local_458.
           super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish !=
           local_458.
           super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start) {
    lVar8 = 0;
    uVar5 = 0;
    do {
      _Var3._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
      local_428.field_2._M_allocated_capacity = 0;
      local_428.field_2._8_8_ = 0;
      local_428._M_dataplus._M_p = (pointer)0x0;
      local_428._M_string_length = 0;
      bVar4 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                        (_Var3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )(_Var3._M_current + __return_storage_ptr__->_M_string_length),
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&local_428,
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                         ((long)&(local_458.
                                  super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_flags + lVar8),0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_428._M_dataplus._M_p,
                        local_428.field_2._M_allocated_capacity - (long)local_428._M_dataplus._M_p);
      }
      if (bVar4) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"characteristic 2 needed for AND/OR/XOR");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar5 = uVar5 + 1;
      lVar8 = lVar8 + 0x20;
    } while (uVar5 < (ulong)((long)local_458.
                                   super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_458.
                                   super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2a0);
  std::
  vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
  ::~vector(&local_458);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (&local_250);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (&local_230);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (&local_210);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (&local_1f0);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (&local_1d0);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (&local_288);
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_268);
  std::
  vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
  ::~vector(&local_440);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (&local_1b0);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (&local_190);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (&local_170);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (&local_150);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (&local_130);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (&local_110);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (&local_f0);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (&local_d0);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (&local_b0);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (&local_90);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (&local_70);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string translateOperatorNames(const std::string& s, int characteristic)
{
  // TODO (created 19 Jan 2021: this doesn't handle A or(A and B) (paren after or, and, xor).
  // fix this.  Can this code be simplified?
  // possibly change to a translate(string, word, replacement word) (perhaps no regex here?)

  // Oct 12, 2021: Not allowing AND/OR is characteristic != 2, but this isn't where it will fail.
  std::regex m1 ("(\\bMAX )");
  std::regex m2 ("(\\bmax )");
  std::regex m3 ("(\\bMAX\\()");
  std::regex m4 ("(\\bmax\\()");

  std::regex m5 ("(\\bMIN )");
  std::regex m6 ("(\\bmin )");
  std::regex m7 ("(\\bMIN\\()");
  std::regex m8 ("(\\bmin\\()");

  std::regex m9 ("(\\bNOT )");
  std::regex m10 ("(\\bnot )");
  std::regex m11 ("(\\bNOT\\()");
  std::regex m12 ("(\\bnot\\()");

  std::vector<std::regex> mreps =  { m1,  m2,   m3,   m4,  m5,  m6,   m7,   m8,  m9, m10,  m11,  m12};
  std::vector<std::string> mstrs = {">", ">", ">(", ">(", "<", "<", "<(", "<(", "~", "~", "~(", "~("};

  auto result = s;
  for (int i = 0; i < mreps.size(); ++i)
    {
      result = std::regex_replace(result, mreps[i], mstrs[i]);
    }
  
  std::regex e1 ("(\\bAND) +");
  std::regex e2 ("(\\band) +");
  std::regex e3 ("(\\bOR +)");
  std::regex e4 ("(\\bor +)");
  std::regex e5 ("(\\bXOR +)");
  std::regex e6 ("(\\bxor +)");

  std::vector<std::regex> ereps =  {  e1,  e2,  e3,  e4,  e5,  e6};
  std::vector<std::string> estrs = { "*", "*", "|", "|", "+", "+"};

  // if char=2 search and replace, if char!=2 search and error
  if (characteristic == 2)
    {
      for (int i = 0; i < ereps.size(); ++i)
        {
          result = std::regex_replace(result, ereps[i], estrs[i]);
        }
    }
  else
    {
      for (int i = 0; i < ereps.size(); ++i)
        {
          if(std::regex_search(result, ereps[i]))
            throw std::runtime_error("characteristic 2 needed for AND/OR/XOR");
        }
    }
  
  return result;
}